

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O1

bool __thiscall
google::protobuf::compiler::Parser::ParseTopLevelStatement
          (Parser *this,FileDescriptorProto *file,LocationRecorder *root_location)

{
  pointer pcVar1;
  size_type sVar2;
  bool bVar3;
  int iVar4;
  EnumDescriptorProto *enum_type;
  DescriptorProto *message;
  ServiceDescriptorProto *service;
  FileOptions *options;
  FileDescriptorProto *containing_file;
  size_type __rlen;
  string_view text;
  SymbolVisibility visibility;
  LocationRecorder location;
  SymbolVisibility local_44;
  LocationRecorder local_40;
  
  containing_file = (FileDescriptorProto *)0x0;
  text._M_str = ";";
  text._M_len = 1;
  bVar3 = TryConsumeEndOfDeclaration(this,text,(LocationRecorder *)0x0);
  if (bVar3) {
    return true;
  }
  local_44 = VISIBILITY_UNSET;
  pcVar1 = (this->input_->current_).text._M_dataplus._M_p;
  sVar2 = (this->input_->current_).text._M_string_length;
  if (sVar2 == 5) {
    local_44 = VISIBILITY_UNSET;
    iVar4 = bcmp(pcVar1,"local",5);
joined_r0x001fa963:
    if ((iVar4 == 0) && (bVar3 = ParseVisibility(this,file,&local_44), !bVar3)) {
      return false;
    }
  }
  else if (sVar2 == 6) {
    iVar4 = bcmp(pcVar1,"export",6);
    goto joined_r0x001fa963;
  }
  pcVar1 = (this->input_->current_).text._M_dataplus._M_p;
  sVar2 = (this->input_->current_).text._M_string_length;
  if (sVar2 == 4) {
    iVar4 = bcmp(pcVar1,"enum",4);
    if (iVar4 != 0) goto LAB_001faaac;
    LocationRecorder::LocationRecorder
              (&local_40,root_location,5,*(int *)((long)&file->field_0 + 0x40));
    enum_type = (EnumDescriptorProto *)
                internal::RepeatedPtrFieldBase::AddMessageLite
                          (&(file->field_0)._impl_.enum_type_.super_RepeatedPtrFieldBase,
                           Arena::DefaultConstruct<google::protobuf::EnumDescriptorProto>);
    bVar3 = ParseEnumDefinition(this,enum_type,&local_44,&local_40,file);
  }
  else if (sVar2 == 6) {
    iVar4 = bcmp(pcVar1,"extend",6);
    if (iVar4 == 0) {
      LocationRecorder::LocationRecorder(&local_40,root_location,7);
      bVar3 = ParseExtend(this,&(file->field_0)._impl_.extension_,
                          &(file->field_0)._impl_.message_type_,root_location,4,&local_40,file);
    }
    else {
      iVar4 = bcmp(pcVar1,"import",6);
      if (iVar4 == 0) {
        bVar3 = ParseImport(this,&(file->field_0)._impl_.dependency_,
                            &(file->field_0)._impl_.public_dependency_,
                            &(file->field_0)._impl_.weak_dependency_,root_location,file);
        return bVar3;
      }
      iVar4 = bcmp(pcVar1,"option",6);
      if (iVar4 != 0) goto LAB_001faaac;
      LocationRecorder::LocationRecorder(&local_40,root_location,8);
      options = FileDescriptorProto::mutable_options(file);
      bVar3 = ParseOption(this,&options->super_Message,&local_40,file,OPTION_STATEMENT);
    }
  }
  else {
    if (sVar2 != 7) {
LAB_001faaac:
      RecordError(this,(ErrorMaker)ZEXT816(0x3e8d1b));
      return false;
    }
    iVar4 = bcmp(pcVar1,"message",7);
    if (iVar4 == 0) {
      LocationRecorder::LocationRecorder
                (&local_40,root_location,4,*(int *)((long)&file->field_0 + 0x28));
      this->recursion_depth_ = 0x20;
      message = (DescriptorProto *)
                internal::RepeatedPtrFieldBase::AddMessageLite
                          (&(file->field_0)._impl_.message_type_.super_RepeatedPtrFieldBase,
                           Arena::DefaultConstruct<google::protobuf::DescriptorProto>);
      bVar3 = ParseMessageDefinition(this,message,&local_44,&local_40,file);
    }
    else {
      iVar4 = bcmp(pcVar1,"service",7);
      if (iVar4 != 0) {
        iVar4 = bcmp(pcVar1,"package",7);
        if (iVar4 == 0) {
          bVar3 = ParsePackage(this,file,root_location,containing_file);
          return bVar3;
        }
        goto LAB_001faaac;
      }
      LocationRecorder::LocationRecorder
                (&local_40,root_location,6,*(int *)((long)&file->field_0 + 0x58));
      service = (ServiceDescriptorProto *)
                internal::RepeatedPtrFieldBase::AddMessageLite
                          (&(file->field_0)._impl_.service_.super_RepeatedPtrFieldBase,
                           Arena::DefaultConstruct<google::protobuf::ServiceDescriptorProto>);
      bVar3 = ParseServiceDefinition(this,service,&local_40,file);
    }
  }
  LocationRecorder::~LocationRecorder(&local_40);
  return bVar3;
}

Assistant:

bool Parser::ParseTopLevelStatement(FileDescriptorProto* file,
                                    const LocationRecorder& root_location) {
  if (TryConsumeEndOfDeclaration(";", nullptr)) {
    // empty statement; ignore
    return true;
  }

  SymbolVisibility visibility = SymbolVisibility::VISIBILITY_UNSET;
  if (LookingAt("export") || LookingAt("local")) {
    DO(ParseVisibility(file, &visibility));
  }

  if (LookingAt("message")) {
    LocationRecorder location(root_location,
                              FileDescriptorProto::kMessageTypeFieldNumber,
                              file->message_type_size());
    // Maximum depth allowed by the DescriptorPool.
    recursion_depth_ = internal::cpp::MaxMessageDeclarationNestingDepth();
    return ParseMessageDefinition(file->add_message_type(), visibility,
                                  location, file);
  } else if (LookingAt("enum")) {
    LocationRecorder location(root_location,
                              FileDescriptorProto::kEnumTypeFieldNumber,
                              file->enum_type_size());
    return ParseEnumDefinition(file->add_enum_type(), visibility, location,
                               file);
  } else if (LookingAt("service")) {
    LocationRecorder location(root_location,
                              FileDescriptorProto::kServiceFieldNumber,
                              file->service_size());
    return ParseServiceDefinition(file->add_service(), location, file);
  } else if (LookingAt("extend")) {
    LocationRecorder location(root_location,
                              FileDescriptorProto::kExtensionFieldNumber);
    return ParseExtend(
        file->mutable_extension(), file->mutable_message_type(), root_location,
        FileDescriptorProto::kMessageTypeFieldNumber, location, file);
  } else if (LookingAt("import")) {
    return ParseImport(file->mutable_dependency(),
                       file->mutable_public_dependency(),
                       file->mutable_weak_dependency(), root_location, file);
  } else if (LookingAt("package")) {
    return ParsePackage(file, root_location, file);
  } else if (LookingAt("option")) {
    LocationRecorder location(root_location,
                              FileDescriptorProto::kOptionsFieldNumber);
    return ParseOption(file->mutable_options(), location, file,
                       OPTION_STATEMENT);
  } else {
    RecordError("Expected top-level statement (e.g. \"message\").");
    return false;
  }
}